

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CGL::Collada::ColladaParser::parse_light(XMLElement *xml,LightInfo *light)

{
  bool bVar1;
  XMLElement *pXVar2;
  XMLElement *pXVar3;
  char *pcVar4;
  XMLElement *pXVar5;
  XMLElement *pXVar6;
  XMLElement *this;
  string *this_00;
  double dVar7;
  string color_string;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_278;
  XMLElement *local_258;
  string type;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::assign((char *)&(light->super_Instance).id);
  tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  std::__cxx11::string::assign((char *)&(light->super_Instance).name);
  (light->super_Instance).type = LIGHT;
  pXVar2 = get_technique_common(xml);
  pXVar3 = get_technique_CGL(xml);
  if (pXVar3 != (XMLElement *)0x0) {
    pXVar2 = pXVar3;
  }
  if (pXVar2 == (XMLElement *)0x0) goto LAB_0011379f;
  pXVar2 = tinyxml2::XMLNode::FirstChildElement(&pXVar2->super_XMLNode,(char *)0x0);
  if (pXVar2 == (XMLElement *)0x0) {
    return;
  }
  pcVar4 = tinyxml2::XMLNode::Value(&pXVar2->super_XMLNode);
  std::__cxx11::string::string((string *)&type,pcVar4,(allocator *)&color_string);
  bVar1 = std::operator==(&type,"ambient");
  if (bVar1) {
    light->light_type = AMBIENT;
    std::__cxx11::string::string((string *)&local_50,"color",(allocator *)&color_string);
    pXVar2 = get_element(pXVar2,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pXVar2 == (XMLElement *)0x0) goto LAB_0011379f;
    pcVar4 = tinyxml2::XMLElement::GetText(pXVar2);
    std::__cxx11::string::string((string *)&color_string,pcVar4,(allocator *)&local_278.field_0);
    std::__cxx11::string::string((string *)&local_70,(string *)&color_string);
    spectrum_from_string((Vector3D *)&local_278.field_0,&local_70);
    (light->spectrum).field_0.field_0.x = local_278.field_0.x;
    (light->spectrum).field_0.field_0.y = local_278.field_0.y;
    (light->spectrum).field_0.field_0.z = local_278.field_0.z;
    *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18) = local_278._24_8_;
    this_00 = &local_70;
  }
  else {
    bVar1 = std::operator==(&type,"directional");
    if (bVar1) {
      light->light_type = DIRECTIONAL;
      std::__cxx11::string::string((string *)&local_90,"color",(allocator *)&color_string);
      pXVar2 = get_element(pXVar2,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (pXVar2 == (XMLElement *)0x0) goto LAB_0011379f;
      pcVar4 = tinyxml2::XMLElement::GetText(pXVar2);
      std::__cxx11::string::string((string *)&color_string,pcVar4,(allocator *)&local_278.field_0);
      std::__cxx11::string::string((string *)&local_b0,(string *)&color_string);
      spectrum_from_string((Vector3D *)&local_278.field_0,&local_b0);
      (light->spectrum).field_0.field_0.x = local_278.field_0.x;
      (light->spectrum).field_0.field_0.y = local_278.field_0.y;
      (light->spectrum).field_0.field_0.z = local_278.field_0.z;
      *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18) = local_278._24_8_;
      this_00 = &local_b0;
    }
    else {
      bVar1 = std::operator==(&type,"area");
      if (!bVar1) {
        bVar1 = std::operator==(&type,"point");
        if (bVar1) {
          light->light_type = POINT;
          std::__cxx11::string::string((string *)&local_110,"color",(allocator *)&color_string);
          pXVar3 = get_element(pXVar2,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::string
                    ((string *)&local_130,"constant_attenuation",(allocator *)&color_string);
          pXVar5 = get_element(pXVar2,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::string
                    ((string *)&local_150,"linear_attenuation",(allocator *)&color_string);
          pXVar6 = get_element(pXVar2,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::string
                    ((string *)&local_170,"quadratic_attenuation",(allocator *)&color_string);
          pXVar2 = get_element(pXVar2,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          if (((pXVar3 == (XMLElement *)0x0) || (pXVar5 == (XMLElement *)0x0)) ||
             ((pXVar6 == (XMLElement *)0x0 || (pXVar2 == (XMLElement *)0x0)))) goto LAB_0011379f;
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
          std::__cxx11::string::string
                    ((string *)&color_string,pcVar4,(allocator *)&local_278.field_0);
          std::__cxx11::string::string((string *)&local_190,(string *)&color_string);
          spectrum_from_string((Vector3D *)&local_278.field_0,&local_190);
          (light->spectrum).field_0.field_0.x = local_278.field_0.x;
          (light->spectrum).field_0.field_0.y = local_278.field_0.y;
          (light->spectrum).field_0.field_0.z = local_278.field_0.z;
          *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18) = local_278._24_8_;
          std::__cxx11::string::~string((string *)&local_190);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar5);
          dVar7 = atof(pcVar4);
          light->constant_att = (float)dVar7;
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar6);
          dVar7 = atof(pcVar4);
          light->constant_att = (float)dVar7;
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar2);
        }
        else {
          bVar1 = std::operator==(&type,"spot");
          if (!bVar1) {
LAB_0011379f:
            exit(1);
          }
          light->light_type = SPOT;
          std::__cxx11::string::string((string *)&local_1b0,"color",(allocator *)&color_string);
          pXVar3 = get_element(pXVar2,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          pXVar5 = tinyxml2::XMLNode::FirstChildElement(&pXVar2->super_XMLNode,"falloff_angle");
          local_258 = tinyxml2::XMLNode::FirstChildElement
                                (&pXVar2->super_XMLNode,"falloff_exponent");
          std::__cxx11::string::string
                    ((string *)&local_1d0,"constant_attenuation",(allocator *)&color_string);
          pXVar6 = get_element(pXVar2,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::string
                    ((string *)&local_1f0,"linear_attenuation",(allocator *)&color_string);
          this = get_element(pXVar2,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::string
                    ((string *)&local_210,"quadratic_attenuation",(allocator *)&color_string);
          pXVar2 = get_element(pXVar2,&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          if (((((pXVar3 == (XMLElement *)0x0) || (pXVar5 == (XMLElement *)0x0)) ||
               (local_258 == (XMLElement *)0x0)) ||
              ((pXVar6 == (XMLElement *)0x0 || (this == (XMLElement *)0x0)))) ||
             (pXVar2 == (XMLElement *)0x0)) goto LAB_0011379f;
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar3);
          std::__cxx11::string::string
                    ((string *)&color_string,pcVar4,(allocator *)&local_278.field_0);
          std::__cxx11::string::string((string *)&local_230,(string *)&color_string);
          spectrum_from_string((Vector3D *)&local_278.field_0,&local_230);
          (light->spectrum).field_0.field_0.x = local_278.field_0.x;
          (light->spectrum).field_0.field_0.y = local_278.field_0.y;
          (light->spectrum).field_0.field_0.z = local_278.field_0.z;
          *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18) = local_278._24_8_;
          std::__cxx11::string::~string((string *)&local_230);
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar5);
          dVar7 = atof(pcVar4);
          light->constant_att = (float)dVar7;
          pcVar4 = tinyxml2::XMLElement::GetText(local_258);
          dVar7 = atof(pcVar4);
          light->constant_att = (float)dVar7;
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar6);
          dVar7 = atof(pcVar4);
          light->constant_att = (float)dVar7;
          pcVar4 = tinyxml2::XMLElement::GetText(this);
          dVar7 = atof(pcVar4);
          light->constant_att = (float)dVar7;
          pcVar4 = tinyxml2::XMLElement::GetText(pXVar2);
        }
        dVar7 = atof(pcVar4);
        light->constant_att = (float)dVar7;
        goto LAB_00113387;
      }
      light->light_type = AREA;
      std::__cxx11::string::string((string *)&local_d0,"color",(allocator *)&color_string);
      pXVar2 = get_element(pXVar2,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      if (pXVar2 == (XMLElement *)0x0) goto LAB_0011379f;
      pcVar4 = tinyxml2::XMLElement::GetText(pXVar2);
      std::__cxx11::string::string((string *)&color_string,pcVar4,(allocator *)&local_278.field_0);
      std::__cxx11::string::string((string *)&local_f0,(string *)&color_string);
      spectrum_from_string((Vector3D *)&local_278.field_0,&local_f0);
      (light->spectrum).field_0.field_0.x = local_278.field_0.x;
      (light->spectrum).field_0.field_0.y = local_278.field_0.y;
      (light->spectrum).field_0.field_0.z = local_278.field_0.z;
      *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18) = local_278._24_8_;
      this_00 = &local_f0;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00113387:
  std::__cxx11::string::~string((string *)&color_string);
  std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void ColladaParser::parse_light( XMLElement* xml, LightInfo& light ) {

  // name & id
  light.id   = xml->Attribute( "id" );
  light.name = xml->Attribute("name");
  light.type = Instance::LIGHT;

  XMLElement* technique = NULL;
  XMLElement* technique_common = get_technique_common(xml);
  XMLElement* technique_CGL = get_technique_CGL(xml);

  technique = technique_CGL ? technique_CGL : technique_common;
  if (!technique) {
    stat("Error: No supported profile defined in light: " << light.id);
    exit(EXIT_FAILURE);
  }

  // light parameters
  XMLElement* e_light = technique->FirstChildElement();
  if (e_light) {

    // type
    string type = e_light->Name();

    // type-specific parameters
    if (type == "ambient") {
      light.light_type = LightType::AMBIENT;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
      } else {
        stat("Error: No color definition in ambient light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "directional") {
      light.light_type = LightType::DIRECTIONAL;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
      } else {
        stat("Error: No color definition in directional light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "area") {
      light.light_type = LightType::AREA;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
      } else {
        stat("Error: No color definition in area light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "point") {
      light.light_type = LightType::POINT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att = get_element(e_light, "quadratic_attenuation");
      if (e_color && e_constant_att && e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of point light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "spot") {
      light.light_type = LightType::SPOT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_falloff_deg = e_light->FirstChildElement("falloff_angle");
      XMLElement* e_falloff_exp = e_light->FirstChildElement("falloff_exponent");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att = get_element(e_light, "quadratic_attenuation");
      if (e_color && e_falloff_deg && e_falloff_exp &&
          e_constant_att && e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
        light.constant_att = atof(e_falloff_deg->GetText());
        light.constant_att = atof(e_falloff_exp->GetText());
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of spot light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else {
      stat("Error: Light type " << type << " in light: " << light.id << "is not supported");
      exit(EXIT_FAILURE);
    }

  }

  // print summary
  stat("  |- " << light);
}